

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_rect.cxx
# Opt level: O0

void __thiscall Fl_Graphics_Driver::yxline(Fl_Graphics_Driver *this,int x,int y,int y1)

{
  Display *pDVar1;
  Window WVar2;
  GC p_Var3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int y1_local;
  int y_local;
  int x_local;
  Fl_Graphics_Driver *this_local;
  
  p_Var3 = fl_gc;
  WVar2 = fl_window;
  pDVar1 = fl_display;
  iVar4 = clip_x(x);
  iVar5 = clip_x(y);
  iVar6 = clip_x(x);
  iVar7 = clip_x(y1);
  XDrawLine(pDVar1,WVar2,p_Var3,iVar4,iVar5,iVar6,iVar7);
  return;
}

Assistant:

void Fl_Graphics_Driver::yxline(int x, int y, int y1) {
#if defined(USE_X11)
  XDrawLine(fl_display, fl_window, fl_gc, clip_x(x), clip_x(y), clip_x(x), clip_x(y1));
#elif defined(WIN32)
  if (y1 < y) y1--;
  else y1++;
  MoveToEx(fl_gc, x, y, 0L); LineTo(fl_gc, x, y1);
#elif defined(__APPLE_QUARTZ__)
  if (USINGQUARTZPRINTER || fl_quartz_line_width_ > 1.5f) CGContextSetShouldAntialias(fl_gc, true);
  CGContextMoveToPoint(fl_gc, x, y);
  CGContextAddLineToPoint(fl_gc, x, y1);
  CGContextStrokePath(fl_gc);
  if (Fl_Display_Device::high_resolution()) {
    CGContextFillRect(fl_gc, CGRectMake(x  -  fl_quartz_line_width_/2, y-0.5, fl_quartz_line_width_, 1));
    CGContextFillRect(fl_gc, CGRectMake(x  -  fl_quartz_line_width_/2, y1-0.5, fl_quartz_line_width_, 1));
  }
  if (USINGQUARTZPRINTER || fl_quartz_line_width_ > 1.5f) CGContextSetShouldAntialias(fl_gc, false);
#else
# error unsupported platform
#endif
}